

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

AST * jsonnet::internal::left_recursive(AST *ast_)

{
  long in_RDI;
  InSuper *ast_4;
  Index *ast_3;
  Binary *ast_2;
  ApplyBrace *ast_1;
  Apply *ast;
  long local_88;
  long local_78;
  long local_68;
  long local_58;
  long local_48;
  AST *local_8;
  
  if (in_RDI == 0) {
    local_48 = 0;
  }
  else {
    local_48 = __dynamic_cast(in_RDI,&AST::typeinfo,&Apply::typeinfo,0);
  }
  if (local_48 == 0) {
    if (in_RDI == 0) {
      local_58 = 0;
    }
    else {
      local_58 = __dynamic_cast(in_RDI,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    }
    if (local_58 == 0) {
      if (in_RDI == 0) {
        local_68 = 0;
      }
      else {
        local_68 = __dynamic_cast(in_RDI,&AST::typeinfo,&Binary::typeinfo,0);
      }
      if (local_68 == 0) {
        if (in_RDI == 0) {
          local_78 = 0;
        }
        else {
          local_78 = __dynamic_cast(in_RDI,&AST::typeinfo,&Index::typeinfo,0);
        }
        if (local_78 == 0) {
          if (in_RDI == 0) {
            local_88 = 0;
          }
          else {
            local_88 = __dynamic_cast(in_RDI,&AST::typeinfo,&InSuper::typeinfo,0);
          }
          if (local_88 == 0) {
            local_8 = (AST *)0x0;
          }
          else {
            local_8 = *(AST **)(local_88 + 0x80);
          }
        }
        else {
          local_8 = *(AST **)(local_78 + 0x80);
        }
      }
      else {
        local_8 = *(AST **)(local_68 + 0x80);
      }
    }
    else {
      local_8 = *(AST **)(local_58 + 0x80);
    }
  }
  else {
    local_8 = *(AST **)(local_48 + 0x80);
  }
  return local_8;
}

Assistant:

static AST *left_recursive(AST *ast_)
{
    if (auto *ast = dynamic_cast<Apply *>(ast_))
        return ast->target;
    if (auto *ast = dynamic_cast<ApplyBrace *>(ast_))
        return ast->left;
    if (auto *ast = dynamic_cast<Binary *>(ast_))
        return ast->left;
    if (auto *ast = dynamic_cast<Index *>(ast_))
        return ast->target;
    if (auto *ast = dynamic_cast<InSuper *>(ast_))
        return ast->element;
    return nullptr;
}